

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectExpression.cpp
# Opt level: O0

void __thiscall
ObjectExpression::putFunction
          (ObjectExpression *this,Identifier *ident,Scope scope,ptr<Function> *function)

{
  mapped_type *this_00;
  Identifier local_78;
  undefined1 local_58 [8];
  Symbol symbol;
  ptr<Function> *function_local;
  Scope scope_local;
  Identifier *ident_local;
  ObjectExpression *this_local;
  
  symbol._40_8_ = function;
  std::__cxx11::string::string((string *)&local_78,(string *)ident);
  Symbol::Symbol((Symbol *)local_58,&local_78,false,scope);
  std::__cxx11::string::~string((string *)&local_78);
  this_00 = std::
            unordered_map<Symbol,_std::shared_ptr<Function>,_SymbolHashFunction,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Function>_>_>_>
            ::operator[](&this->functionMap,(key_type *)local_58);
  std::shared_ptr<Function>::operator=(this_00,function);
  Symbol::~Symbol((Symbol *)local_58);
  return;
}

Assistant:

void ObjectExpression::putFunction(const Identifier &ident, Scope scope, ptr<Function> function) {
    Symbol symbol(ident, false, scope);
    functionMap[symbol] = std::move(function);
}